

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_find_qindex(double desired_q,aom_bit_depth_t bit_depth,int best_qindex,int worst_qindex)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  double in_XMM0_Qa;
  double mid_q;
  int mid;
  int high;
  int low;
  double in_stack_ffffffffffffffd8;
  int local_1c;
  int local_18;
  
  iVar1 = in_EDX;
  local_18 = in_ESI;
  while (local_1c = iVar1, local_18 < local_1c) {
    iVar1 = local_18 + local_1c >> 1;
    in_stack_ffffffffffffffd8 =
         av1_convert_qindex_to_q
                   ((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                    SUB84(in_stack_ffffffffffffffd8,0));
    if (in_stack_ffffffffffffffd8 < in_XMM0_Qa) {
      local_18 = iVar1 + 1;
      iVar1 = local_1c;
    }
  }
  return local_18;
}

Assistant:

int av1_find_qindex(double desired_q, aom_bit_depth_t bit_depth,
                    int best_qindex, int worst_qindex) {
  assert(best_qindex <= worst_qindex);
  int low = best_qindex;
  int high = worst_qindex;
  while (low < high) {
    const int mid = (low + high) >> 1;
    const double mid_q = av1_convert_qindex_to_q(mid, bit_depth);
    if (mid_q < desired_q) {
      low = mid + 1;
    } else {
      high = mid;
    }
  }
  assert(low == high);
  assert(av1_convert_qindex_to_q(low, bit_depth) >= desired_q ||
         low == worst_qindex);
  return low;
}